

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O3

Literals * wasm::Literal::makeNegOnes(Literals *__return_storage_ptr__,Type type)

{
  Type *pTVar1;
  Type *pTVar2;
  Literal local_60;
  Type local_48;
  Type type_local;
  Iterator __begin1;
  
  local_48.id = type.id;
  if (1 < type.id) {
    (__return_storage_ptr__->super_SmallVector<wasm::Literal,_1UL>).flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super_SmallVector<wasm::Literal,_1UL>).flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems[0].field_0.func.
    super_IString.str._M_str = (char *)0x0;
    (__return_storage_ptr__->super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems[0].type.id = 0;
    (__return_storage_ptr__->super_SmallVector<wasm::Literal,_1UL>).usedFixed = 0;
    (__return_storage_ptr__->super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems[0].field_0.i64 =
         0;
    (__return_storage_ptr__->super_SmallVector<wasm::Literal,_1UL>).flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    __begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
         (Type *)0x0;
    type_local.id = (uintptr_t)&local_48;
    pTVar1 = (Type *)wasm::Type::size(&local_48);
    if (pTVar1 != (Type *)0x0) {
      do {
        do {
          pTVar2 = wasm::Type::Iterator::operator*((Iterator *)&type_local);
          makeNegOne(&local_60,(Type)pTVar2->id);
          SmallVector<wasm::Literal,_1UL>::push_back
                    (&__return_storage_ptr__->super_SmallVector<wasm::Literal,_1UL>,&local_60);
          ~Literal(&local_60);
          __begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
               (Type *)((long)&(__begin1.
                                super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                               parent)->id + 1);
        } while (__begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent
                 != pTVar1);
      } while ((Type *)type_local.id != &local_48);
    }
    return __return_storage_ptr__;
  }
  __assert_fail("type.isConcrete()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/literal.cpp"
                ,0xdf,"static Literals wasm::Literal::makeNegOnes(Type)");
}

Assistant:

Literals Literal::makeNegOnes(Type type) {
  assert(type.isConcrete());
  Literals units;
  for (const auto& t : type) {
    units.push_back(makeNegOne(t));
  }
  return units;
}